

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_singletons.c
# Opt level: O1

lu_int __thiscall lu_singletons(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  int *piVar1;
  lu_int *pinv;
  size_t __n;
  double abstol;
  int m;
  int iVar2;
  int iVar3;
  uint uVar4;
  double *col_pivot;
  double *Lx;
  double *Lx_00;
  double *Ux;
  double *Btx;
  lu_int *Lp;
  lu_int *Ui;
  double *Ux_00;
  lu_int *Up;
  lu_int *Ui_00;
  lu_int *Bti;
  lu_int *Bti_00;
  bool bVar5;
  lu_int lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  lu_int *plVar17;
  lu_int *in_stack_ffffffffffffff38;
  double *Bx_00;
  
  m = *(int *)((long)this + 0x54);
  uVar14 = (ulong)m;
  if ((long)uVar14 < 1) {
    iVar12 = 0;
    bVar5 = true;
  }
  else {
    uVar10 = 1;
    iVar12 = 0;
    do {
      iVar2 = Bend[uVar10 - 1];
      iVar16 = Bbegin[uVar10 - 1];
      iVar11 = iVar2 - iVar16;
      bVar5 = iVar16 <= iVar2;
      if (iVar2 < iVar16) {
        iVar11 = 0;
      }
      iVar12 = iVar11 + iVar12;
    } while ((uVar10 < uVar14) && (uVar10 = uVar10 + 1, iVar16 <= iVar2));
  }
  lVar6 = -4;
  if (bVar5) {
    iVar2 = *(int *)((long)this + 4);
    iVar16 = *this;
    iVar11 = iVar12 - iVar16;
    if (iVar11 != 0 && iVar16 <= iVar12) {
      *(int *)((long)this + 0x58) = iVar11;
    }
    iVar3 = *(int *)((long)this + 8);
    iVar13 = iVar12 - iVar2;
    if (iVar13 != 0 && iVar2 <= iVar12) {
      *(int *)((long)this + 0x5c) = iVar13;
    }
    iVar7 = iVar12 - iVar3;
    if (iVar7 != 0 && iVar3 <= iVar12) {
      *(int *)((long)this + 0x60) = iVar7;
    }
    if (iVar7 != 0 && iVar3 <= iVar12 ||
        (iVar13 != 0 && iVar2 <= iVar12 || iVar11 != 0 && iVar16 <= iVar12)) {
      lVar6 = 1;
    }
    else {
      col_pivot = *(double **)((long)this + 0x210);
      abstol = *(double *)((long)this + 0x18);
      iVar2 = *(int *)((long)this + 0x28);
      Lx = *(double **)((long)this + 600);
      Lx_00 = *(double **)((long)this + 0x268);
      Ux = *(double **)((long)this + 0x278);
      Btx = *(double **)((long)this + 0x280);
      Lp = *(lu_int **)((long)this + 0x2a8);
      Ui = *(lu_int **)((long)this + 0x1a0);
      Ux_00 = *(double **)((long)this + 0x1b8);
      Up = *(lu_int **)((long)this + 0x1a8);
      Ui_00 = *(lu_int **)((long)this + 0x1c0);
      Bx_00 = *(double **)((long)this + 0x218);
      Bti = *(lu_int **)((long)this + 0x1b0);
      Bti_00 = *(lu_int **)((long)this + 0x1c8);
      __n = uVar14 * 4;
      iVar16 = 0;
      plVar17 = (lu_int *)0x3c0577;
      memset(col_pivot,0,__n);
      if (0 < m) {
        uVar10 = 0;
        do {
          lVar8 = (long)Bbegin[uVar10];
          bVar5 = true;
          if (Bbegin[uVar10] < Bend[uVar10]) {
            do {
              lVar9 = lVar8 + 1;
              uVar4 = Bi[lVar8];
              bVar5 = (int)uVar4 < m && -1 < (int)uVar4;
              if ((int)uVar4 < m && -1 < (int)uVar4) {
                piVar1 = (int *)((long)col_pivot + (ulong)uVar4 * 4);
                *piVar1 = *piVar1 + 1;
              }
              lVar8 = lVar9;
            } while (bVar5 && lVar9 < Bend[uVar10]);
          }
          uVar10 = uVar10 + 1;
        } while ((uVar10 < uVar14) && (bVar5));
        if (!bVar5) {
          return -4;
        }
      }
      if (0 < m) {
        uVar10 = 0;
        iVar11 = 0;
        do {
          *(int *)((long)Bx_00 + uVar10 * 4) = iVar11;
          iVar16 = *(int *)((long)col_pivot + uVar10 * 4) + iVar11;
          *(int *)((long)col_pivot + uVar10 * 4) = iVar11;
          uVar10 = uVar10 + 1;
          iVar11 = iVar16;
        } while (uVar14 != uVar10);
      }
      *(int *)((long)Bx_00 + uVar14 * 4) = iVar16;
      if (0 < m) {
        bVar5 = true;
        uVar10 = 0;
        do {
          lVar8 = (long)Bbegin[uVar10];
          if (Bbegin[uVar10] < Bend[uVar10]) {
            do {
              lVar9 = (long)Bi[lVar8];
              iVar16 = *(int *)((long)col_pivot + lVar9 * 4);
              lVar15 = (long)iVar16;
              *(int *)((long)col_pivot + lVar9 * 4) = iVar16 + 1;
              Bti[lVar15] = (lu_int)uVar10;
              *(double *)(Bti_00 + lVar15 * 2) = Bx[lVar8];
              if ((*(int *)((long)Bx_00 + lVar9 * 4) < iVar16) && (uVar10 == (uint)Bti[lVar15 + -1])
                 ) {
                bVar5 = false;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < Bend[uVar10]);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar14);
        if (!bVar5) {
          return -4;
        }
      }
      if (0 < m) {
        memset(Lx,0xff,__n);
        plVar17 = (lu_int *)0x3c06bd;
        memset(Lx_00,0xff,__n);
      }
      pinv = (lu_int *)((long)col_pivot + uVar14 * 4);
      *(undefined4 *)Btx = 0;
      *(undefined4 *)Ux = 0;
      if (iVar2 < 0) {
        lVar6 = singleton_rows(m,Bbegin,Bend,Bi,Bx,(lu_int *)Bx_00,Bti,Btx,(lu_int *)Ux,Ui,Ux_00,Lp,
                               (lu_int *)Lx,Lx_00,col_pivot,pinv,(lu_int *)0x0,plVar17,
                               in_stack_ffffffffffffff38,(lu_int)Bx_00,abstol);
        lVar6 = singleton_cols(m,Bbegin,Bend,Bi,Bx_00,Bti,Bti_00,Btx,Up,Ui_00,Ux,Ui,Lp,Lx,Lx_00,
                               (lu_int *)col_pivot,pinv,(lu_int *)CONCAT44(extraout_var_00,lVar6),
                               in_stack_ffffffffffffff38,(lu_int)Bx_00,abstol);
      }
      else {
        plVar17 = (lu_int *)0x0;
        lVar6 = singleton_cols(m,Bbegin,Bend,Bi,Bx_00,Bti,Bti_00,Btx,Up,Ui_00,Ux,Ui,Lp,Lx,Lx_00,
                               (lu_int *)col_pivot,pinv,(lu_int *)0x0,in_stack_ffffffffffffff38,
                               (lu_int)Bx_00,abstol);
        lVar6 = singleton_rows(m,Bbegin,Bend,Bi,Bx,(lu_int *)Bx_00,Bti,Btx,(lu_int *)Ux,Ui,Ux_00,Lp,
                               (lu_int *)Lx,Lx_00,col_pivot,pinv,
                               (lu_int *)CONCAT44(extraout_var,lVar6),plVar17,
                               in_stack_ffffffffffffff38,(lu_int)Bx_00,abstol);
      }
      if (0 < m) {
        uVar10 = 0;
        do {
          if (*(int *)((long)Lx + uVar10 * 4) < 0) {
            *(undefined4 *)((long)Lx + uVar10 * 4) = 0xffffffff;
          }
          uVar10 = uVar10 + 1;
        } while (uVar14 != uVar10);
      }
      if (0 < m) {
        uVar10 = 0;
        do {
          if (*(int *)((long)Lx_00 + uVar10 * 4) < 0) {
            *(undefined4 *)((long)Lx_00 + uVar10 * 4) = 0xffffffff;
          }
          uVar10 = uVar10 + 1;
        } while (uVar14 != uVar10);
      }
      *(int *)((long)this + 0x138) = iVar12;
      *(lu_int *)((long)this + 0x13c) = lVar6;
      lVar6 = 0;
    }
  }
  return lVar6;
}

Assistant:

lu_int lu_singletons(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m      = this->m;
    const lu_int Lmem   = this->Lmem;
    const lu_int Umem   = this->Umem;
    const lu_int Wmem   = this->Wmem;
    const double abstol = this->abstol;
    const lu_int nzbias = this->nzbias;
    lu_int *pinv        = this->pinv;
    lu_int *qinv        = this->qinv;
    lu_int *Lbegin_p    = this->Lbegin_p;
    lu_int *Ubegin      = this->Ubegin;
    double *col_pivot   = this->col_pivot;
    lu_int *Lindex      = this->Lindex;
    double *Lvalue      = this->Lvalue;
    lu_int *Uindex      = this->Uindex;
    double *Uvalue      = this->Uvalue;
    lu_int *iwork1      = this->iwork1;
    lu_int *iwork2      = iwork1 + m;

    lu_int *Btp         = this->Wbegin; /* build B rowwise in W */
    lu_int *Bti         = this->Windex;
    double *Btx         = this->Wvalue;

    lu_int i, j, pos, put, rank, Bnz, ok;

    /* -------------------------------- */
    /* Check matrix and build transpose */
    /* -------------------------------- */

    /* Check pointers and count nnz(B). */
    Bnz = 0;
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        if (Bend[j] < Bbegin[j])
            ok = 0;
        else
            Bnz += Bend[j] - Bbegin[j];
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Check if sufficient memory in L, U, W. */
    ok = 1;
    if (Lmem < Bnz) { this->addmemL = Bnz-Lmem; ok = 0; }
    if (Umem < Bnz) { this->addmemU = Bnz-Umem; ok = 0; }
    if (Wmem < Bnz) { this->addmemW = Bnz-Wmem; ok = 0; }
    if (!ok)
        return BASICLU_REALLOCATE;

    /* Count nz per row, check indices. */
    memset(iwork1, 0, m*sizeof(lu_int)); /* row counts */
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        for (pos = Bbegin[j]; pos < Bend[j] && ok; pos++)
        {
            i = Bi[pos];
            if (i < 0 || i >= m)
                ok = 0;
            else
                iwork1[i]++;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Pack matrix rowwise, check for duplicates. */
    put = 0;
    for (i = 0; i < m; i++)     /* set row pointers */
    {
        Btp[i] = put;
        put += iwork1[i];
        iwork1[i] = Btp[i];
    }
    Btp[m] = put;
    assert(put == Bnz);
    ok = 1;
    for (j = 0; j < m; j++)     /* fill rows */
    {
        for (pos = Bbegin[j]; pos < Bend[j]; pos++)
        {
            i = Bi[pos];
            put = iwork1[i]++;
            Bti[put] = j;
            Btx[put] = Bx [pos];
            if (put > Btp[i] && Bti[put-1] == j)
                ok = 0;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* ---------------- */
    /* Pivot singletons */
    /* ---------------- */

    /* No pivot rows or pivot columns so far. */
    for (i = 0; i < m; i++)
        pinv[i] = -1;
    for (j = 0; j < m; j++)
        qinv[j] = -1;

    if (nzbias >= 0)            /* put more in U */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }
    else                        /* put more in L */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }

    /* pinv, qinv were used as nonzero counters. Reset to -1 if not pivoted. */
    for (i = 0; i < m; i++)
        if (pinv[i] < 0)
            pinv[i] = -1;
    for (j = 0; j < m; j++)
        if (qinv[j] < 0)
            qinv[j] = -1;

    this->matrix_nz = Bnz;
    this->rank = rank;
    return BASICLU_OK;
}